

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagemapregisterrange.h
# Opt level: O0

CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
 __thiscall
snmalloc::
PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>
::Type<snmalloc::PalRange<snmalloc::PALLinux>_>::alloc_range
          (Type<snmalloc::PalRange<snmalloc::PALLinux>_> *this,size_t size)

{
  Arena<void> in_RSI;
  Arena<void> base;
  PalRange<snmalloc::PALLinux> *in_stack_ffffffffffffffb8;
  void *local_28;
  undefined8 local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  void **local_8;
  
  local_28 = (void *)PalRange<snmalloc::PALLinux>::alloc_range(in_stack_ffffffffffffffb8,0x11170d);
  local_18 = &stack0xffffffffffffffc0;
  local_20 = 0;
  local_8 = &local_28;
  local_10 = &stack0xffffffffffffffc0;
  if (local_28 != (void *)0x0) {
    BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
    ::register_range(in_RSI,0);
  }
  return (CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
          )local_28;
}

Assistant:

CapPtr<void, ChunkBounds> alloc_range(size_t size)
      {
        auto base = parent.alloc_range(size);

        if (base != nullptr)
        {
          Pagemap::register_range(base, size);
        }

        return base;
      }